

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
celero::Printer::TableRowHeader(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  Experiment *x_00;
  Printer *pPVar1;
  
  pPVar1 = (Printer *)
           (x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  x_00 = ExperimentResult::getExperiment((ExperimentResult *)pPVar1);
  TableRowExperimentHeader(pPVar1,x_00);
  pPVar1 = (Printer *)&stack0xffffffffffffffe0;
  std::__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffe0,
             &x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>);
  TableRowProblemSpaceHeader
            (pPVar1,(shared_ptr<celero::ExperimentResult> *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void Printer::TableRowHeader(std::shared_ptr<celero::ExperimentResult> x)
	{
		TableRowExperimentHeader(x->getExperiment());
		TableRowProblemSpaceHeader(x);
	}